

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall fasttext::FastText::saveOutput(FastText *this,string *filename)

{
  byte bVar1;
  invalid_argument *piVar2;
  element_type *peVar3;
  element_type *peVar4;
  ostream *m;
  ostream *os;
  Dictionary *this_00;
  string *in_RSI;
  long in_RDI;
  string word;
  int32_t i;
  Vector vec;
  int32_t n;
  ofstream ofs;
  ostream *in_stack_fffffffffffffd10;
  ostream *in_stack_fffffffffffffd20;
  char *in_stack_fffffffffffffd30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd40;
  int32_t in_stack_fffffffffffffd44;
  int local_2b8;
  string local_288 [28];
  int32_t in_stack_fffffffffffffd94;
  undefined4 in_stack_fffffffffffffd98;
  int iVar5;
  string local_240 [48];
  ostream local_210 [528];
  
  std::ofstream::ofstream(local_210,in_RSI,_S_out);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
    std::invalid_argument::invalid_argument(piVar2,local_240);
    __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if ((*(byte *)(in_RDI + 0x68) & 1) != 0) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar2,"Option -saveOutput is not supported for quantized models.");
    __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x16eec2);
  if (peVar3->model == sup) {
    peVar4 = std::
             __shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x16eed6);
    local_2b8 = Dictionary::nlabels(peVar4);
  }
  else {
    peVar4 = std::
             __shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x16eefc);
    in_stack_fffffffffffffd44 = Dictionary::nwords(peVar4);
    local_2b8 = in_stack_fffffffffffffd44;
  }
  m = (ostream *)std::ostream::operator<<(local_210,local_2b8);
  os = std::operator<<(m," ");
  peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x16ef5c);
  this_00 = (Dictionary *)std::ostream::operator<<(os,peVar3->dim);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x16ef8d);
  Vector::Vector((Vector *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),(int64_t)m)
  ;
  for (iVar5 = 0; iVar5 < local_2b8; iVar5 = iVar5 + 1) {
    peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x16efc9);
    if (peVar3->model == sup) {
      std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x16efdd);
      Dictionary::getLabel_abi_cxx11_
                ((Dictionary *)CONCAT44(iVar5,in_stack_fffffffffffffd98),in_stack_fffffffffffffd94);
    }
    else {
      std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x16f003);
      Dictionary::getWord_abi_cxx11_(this_00,(int32_t)((ulong)in_stack_fffffffffffffd20 >> 0x20));
    }
    Vector::zero((Vector *)in_stack_fffffffffffffd20);
    std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
              ((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_fffffffffffffd10);
    Vector::addRow((Vector *)os,(Matrix *)this_00,(int64_t)in_stack_fffffffffffffd20);
    in_stack_fffffffffffffd20 = std::operator<<(local_210,local_288);
    std::operator<<(in_stack_fffffffffffffd20," ");
    in_stack_fffffffffffffd10 = operator<<(os,(Vector *)this_00);
    std::ostream::operator<<(in_stack_fffffffffffffd10,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_288);
  }
  std::ofstream::close();
  Vector::~Vector((Vector *)0x16f121);
  std::ofstream::~ofstream(local_210);
  return;
}

Assistant:

void FastText::saveOutput(const std::string& filename) {
  std::ofstream ofs(filename);
  if (!ofs.is_open()) {
    throw std::invalid_argument(
        filename + " cannot be opened for saving vectors!");
  }
  if (quant_) {
    throw std::invalid_argument(
        "Option -saveOutput is not supported for quantized models.");
  }
  int32_t n =
      (args_->model == model_name::sup) ? dict_->nlabels() : dict_->nwords();
  ofs << n << " " << args_->dim << std::endl;
  Vector vec(args_->dim);
  for (int32_t i = 0; i < n; i++) {
    std::string word = (args_->model == model_name::sup) ? dict_->getLabel(i)
                                                         : dict_->getWord(i);
    vec.zero();
    vec.addRow(*output_, i);
    ofs << word << " " << vec << std::endl;
  }
  ofs.close();
}